

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

string * __thiscall
spirv_cross::CompilerGLSL::variable_decl_abi_cxx11_
          (string *__return_storage_ptr__,CompilerGLSL *this,SPIRVariable *variable)

{
  SPIRType *pSVar1;
  bool bVar2;
  uint32_t uVar3;
  Types TVar4;
  uint uVar5;
  CompilerError *this_00;
  Variant *pVVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar7;
  string local_1a8 [32];
  string local_188;
  string local_168 [32];
  string local_148;
  uint32_t local_124;
  string local_120 [4];
  uint32_t expr_1;
  string local_100;
  string local_e0;
  string local_c0;
  uint32_t local_9c;
  undefined1 local_98 [4];
  uint32_t expr;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  spirv_cross local_58 [35];
  undefined1 local_35;
  SPIRType *local_28;
  SPIRType *type;
  SPIRVariable *variable_local;
  CompilerGLSL *this_local;
  string *res;
  
  type = (SPIRType *)variable;
  variable_local = (SPIRVariable *)this;
  this_local = (CompilerGLSL *)__return_storage_ptr__;
  local_28 = Compiler::get_variable_data_type(&this->super_Compiler,variable);
  if ((1 < local_28->pointer_depth) && (((this->backend).support_pointer_to_pointer & 1U) == 0)) {
    this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
    CompilerError::CompilerError(this_00,"Cannot declare pointer-to-pointer types.");
    __cxa_throw(this_00,&CompilerError::typeinfo,CompilerError::~CompilerError);
  }
  local_35 = 0;
  uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(type->super_IVariant).self);
  (*(this->super_Compiler)._vptr_Compiler[0x32])(local_58,this,(ulong)uVar3);
  pSVar1 = local_28;
  uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(type->super_IVariant).self);
  (*(this->super_Compiler)._vptr_Compiler[6])(local_98,this,(ulong)uVar3,1);
  uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(type->super_IVariant).self);
  pbVar7 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98;
  (*(this->super_Compiler)._vptr_Compiler[0x1b])(&local_78,this,pSVar1,pbVar7,(ulong)uVar3);
  join<std::__cxx11::string,std::__cxx11::string>(__return_storage_ptr__,local_58,&local_78,pbVar7);
  ::std::__cxx11::string::~string((string *)&local_78);
  ::std::__cxx11::string::~string((string *)local_98);
  ::std::__cxx11::string::~string((string *)local_58);
  if ((((type->member_types).stack_storage.aligned_char[4] & 1U) == 0) ||
     (uVar3 = TypedID::operator_cast_to_unsigned_int
                        ((TypedID *)
                         ((long)&(type->array_size_literal).super_VectorView<bool>.ptr + 4)),
     uVar3 == 0)) {
    uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)&type->vecsize);
    if ((uVar3 != 0) &&
       (uVar5 = (*(this->super_Compiler)._vptr_Compiler[0x1c])(this,type,4), (uVar5 & 1) == 0)) {
      local_124 = TypedID::operator_cast_to_unsigned_int((TypedID *)&type->vecsize);
      pVVar6 = VectorView<spirv_cross::Variant>::operator[]
                         (&(this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>,
                          (ulong)local_124);
      TVar4 = Variant::get_type(pVVar6);
      if (TVar4 == TypeUndef) {
        if ((((this->options).force_zero_initialized_variables & 1U) != 0) &&
           (bVar2 = type_can_zero_initialize(this,local_28), bVar2)) {
          uVar3 = Compiler::get_variable_data_type_id(&this->super_Compiler,(SPIRVariable *)type);
          (*(this->super_Compiler)._vptr_Compiler[0x3a])(local_1a8,this,(ulong)uVar3);
          join<char_const(&)[4],std::__cxx11::string>
                    (&local_188,(spirv_cross *)0x6766c4,(char (*) [4])local_1a8,pbVar7);
          ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_188);
          ::std::__cxx11::string::~string((string *)&local_188);
          ::std::__cxx11::string::~string(local_1a8);
        }
      }
      else {
        (*(this->super_Compiler)._vptr_Compiler[0x39])(local_168,this,type);
        join<char_const(&)[4],std::__cxx11::string>
                  (&local_148,(spirv_cross *)0x6766c4,(char (*) [4])local_168,pbVar7);
        ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_148);
        ::std::__cxx11::string::~string((string *)&local_148);
        ::std::__cxx11::string::~string(local_168);
      }
    }
  }
  else {
    local_9c = TypedID::operator_cast_to_unsigned_int
                         ((TypedID *)
                          ((long)&(type->array_size_literal).super_VectorView<bool>.ptr + 4));
    pVVar6 = VectorView<spirv_cross::Variant>::operator[]
                       (&(this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>,
                        (ulong)local_9c);
    TVar4 = Variant::get_type(pVVar6);
    if (TVar4 == TypeUndef) {
      if ((((this->options).force_zero_initialized_variables & 1U) != 0) &&
         (bVar2 = type_can_zero_initialize(this,local_28), bVar2)) {
        uVar3 = Compiler::get_variable_data_type_id(&this->super_Compiler,(SPIRVariable *)type);
        (*(this->super_Compiler)._vptr_Compiler[0x3a])(local_120,this,(ulong)uVar3);
        join<char_const(&)[4],std::__cxx11::string>
                  (&local_100,(spirv_cross *)0x6766c4,(char (*) [4])local_120,pbVar7);
        ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_100);
        ::std::__cxx11::string::~string((string *)&local_100);
        ::std::__cxx11::string::~string(local_120);
      }
    }
    else {
      uVar3 = TypedID::operator_cast_to_unsigned_int
                        ((TypedID *)
                         ((long)&(type->array_size_literal).super_VectorView<bool>.ptr + 4));
      pbVar7 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1;
      to_unpacked_expression_abi_cxx11_(&local_e0,this,uVar3,true);
      join<char_const(&)[4],std::__cxx11::string>
                (&local_c0,(spirv_cross *)0x6766c4,(char (*) [4])&local_e0,pbVar7);
      ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_c0);
      ::std::__cxx11::string::~string((string *)&local_c0);
      ::std::__cxx11::string::~string((string *)&local_e0);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

string CompilerGLSL::variable_decl(const SPIRVariable &variable)
{
	// Ignore the pointer type since GLSL doesn't have pointers.
	auto &type = get_variable_data_type(variable);

	if (type.pointer_depth > 1 && !backend.support_pointer_to_pointer)
		SPIRV_CROSS_THROW("Cannot declare pointer-to-pointer types.");

	auto res = join(to_qualifiers_glsl(variable.self), variable_decl(type, to_name(variable.self), variable.self));

	if (variable.loop_variable && variable.static_expression)
	{
		uint32_t expr = variable.static_expression;
		if (ir.ids[expr].get_type() != TypeUndef)
			res += join(" = ", to_unpacked_expression(variable.static_expression));
		else if (options.force_zero_initialized_variables && type_can_zero_initialize(type))
			res += join(" = ", to_zero_initialized_expression(get_variable_data_type_id(variable)));
	}
	else if (variable.initializer && !variable_decl_is_remapped_storage(variable, StorageClassWorkgroup))
	{
		uint32_t expr = variable.initializer;
		if (ir.ids[expr].get_type() != TypeUndef)
			res += join(" = ", to_initializer_expression(variable));
		else if (options.force_zero_initialized_variables && type_can_zero_initialize(type))
			res += join(" = ", to_zero_initialized_expression(get_variable_data_type_id(variable)));
	}

	return res;
}